

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O0

size_t fiobj_str_readfile(FIOBJ dest,char *filename,intptr_t start_at,intptr_t limit)

{
  undefined1 local_40 [8];
  fio_str_info_s state;
  intptr_t limit_local;
  intptr_t start_at_local;
  char *filename_local;
  FIOBJ dest_local;
  
  state.data = (char *)limit;
  fio_str_readfile((fio_str_info_s *)local_40,
                   (fio_str_s_conflict *)((dest & 0xfffffffffffffff8) + 0x10),filename,start_at,
                   limit);
  return state.capa;
}

Assistant:

size_t fiobj_str_readfile(FIOBJ dest, const char *filename, intptr_t start_at,
                          intptr_t limit) {
  fio_str_info_s state =
      fio_str_readfile(&obj2str(dest)->str, filename, start_at, limit);
  return state.len;
}